

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

AssertionResult __thiscall
testing::internal::FloatingPointLE<float>
          (internal *this,char *expr1,char *expr2,float val1,float val2)

{
  bool bVar1;
  AssertionResult *pAVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  AssertionResult AVar3;
  stringstream local_3b0 [8];
  stringstream val1_ss;
  long local_3a0;
  undefined8 auStack_398 [13];
  ios_base aiStack_330 [264];
  stringstream local_228 [8];
  stringstream val2_ss;
  long local_218;
  undefined8 auStack_210 [13];
  ios_base aiStack_1a8 [264];
  AssertionResult local_a0;
  string local_90;
  string local_70;
  FloatingPointUnion local_50;
  FloatingPointUnion local_4c;
  FloatingPoint<float> lhs;
  FloatingPoint<float> rhs;
  char *expr1_local;
  char *expr2_local;
  
  if (val2 <= val1) {
    local_50.value_ = val1;
    local_4c.value_ = val2;
    _lhs = expr1;
    expr1_local = expr2;
    expr2_local._0_4_ = val1;
    expr2_local._4_4_ = val2;
    bVar1 = FloatingPoint<float>::AlmostEquals
                      ((FloatingPoint<float> *)&local_50,(FloatingPoint<float> *)&local_4c);
    expr2 = (char *)extraout_RDX;
    if (!bVar1) {
      std::__cxx11::stringstream::stringstream(local_3b0);
      *(undefined8 *)((long)auStack_398 + *(long *)(local_3a0 + -0x18)) = 8;
      std::ostream::_M_insert<double>((double)expr2_local._0_4_);
      std::__cxx11::stringstream::stringstream(local_228);
      *(undefined8 *)((long)auStack_210 + *(long *)(local_218 + -0x18)) = 8;
      std::ostream::_M_insert<double>((double)expr2_local._4_4_);
      local_a0.success_ = false;
      local_a0.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar2 = AssertionResult::operator<<(&local_a0,(char (*) [12])"Expected: (");
      pAVar2 = AssertionResult::operator<<(pAVar2,(char **)&lhs);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [7])") <= (");
      pAVar2 = AssertionResult::operator<<(pAVar2,&expr1_local);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [3])0x187504);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [11])0x186dfb);
      StringStreamToString(&local_90,(stringstream *)local_3b0);
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_90);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [5])" vs ");
      StringStreamToString(&local_70,(stringstream *)local_228);
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_70);
      AssertionResult::AssertionResult((AssertionResult *)this,pAVar2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_a0.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      std::__cxx11::stringstream::~stringstream(local_228);
      std::ios_base::~ios_base(aiStack_1a8);
      std::__cxx11::stringstream::~stringstream(local_3b0);
      std::ios_base::~ios_base(aiStack_330);
      expr2 = (char *)extraout_RDX_00;
      goto LAB_0017b7a1;
    }
  }
  *this = (internal)0x1;
  *(undefined8 *)(this + 8) = 0;
LAB_0017b7a1:
  AVar3.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)expr2;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult FloatingPointLE(const char* expr1,
                                const char* expr2,
                                RawType val1,
                                RawType val2) {
  // Returns success if val1 is less than val2,
  if (val1 < val2) {
    return AssertionSuccess();
  }

  // or if val1 is almost equal to val2.
  const FloatingPoint<RawType> lhs(val1), rhs(val2);
  if (lhs.AlmostEquals(rhs)) {
    return AssertionSuccess();
  }

  // Note that the above two checks will both fail if either val1 or
  // val2 is NaN, as the IEEE floating-point standard requires that
  // any predicate involving a NaN must return false.

  ::std::stringstream val1_ss;
  val1_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
          << val1;

  ::std::stringstream val2_ss;
  val2_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
          << val2;

  return AssertionFailure()
      << "Expected: (" << expr1 << ") <= (" << expr2 << ")\n"
      << "  Actual: " << StringStreamToString(&val1_ss) << " vs "
      << StringStreamToString(&val2_ss);
}